

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O2

void G_VerifySkill(void)

{
  int intval;
  
  if (gameskill.Value < (int)AllSkills.Count) {
    if (-1 < gameskill.Value) {
      return;
    }
    intval = 0;
  }
  else {
    intval = AllSkills.Count - 1;
  }
  FIntCVar::operator=(&gameskill,intval);
  return;
}

Assistant:

inline operator int () const { return Value; }